

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::init(arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  type tVar2;
  undefined4 uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  int in_EAX;
  uint i;
  uint uVar10;
  entry *peVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar5 = *(ulong *)ctx;
  uVar15 = 0xf;
  if ((long)uVar5 < 0) {
    uVar15 = (ulong)(uint)-(int)uVar5;
  }
  peVar11 = (entry *)operator_new__(uVar15 * 0x30);
  if ((int)uVar15 != 0) {
    uVar14 = 0;
    do {
      *(undefined4 *)((long)&(peVar11->arg).type_ + uVar14) = 0;
      puVar6 = (undefined8 *)((long)&(peVar11->name).data_ + uVar14);
      *puVar6 = 0;
      puVar6[1] = 0;
      *(undefined4 *)((long)&(peVar11->arg).value_.field_0 + uVar14) = 0;
      uVar14 = uVar14 + 0x30;
    } while (uVar15 * 0x30 != uVar14);
  }
  this->map_ = peVar11;
  if ((uVar5 & 0xf00000000000000) == 0) {
    bVar12 = 0;
    uVar10 = 0;
    do {
      iVar13 = (int)((0xfL << (bVar12 & 0x3f) & *(ulong *)ctx) >> (bVar12 & 0x3f));
      if (iVar13 == 1) {
        puVar6 = *(undefined8 **)(*(long *)(ctx + 8) + (ulong)uVar10 * 0x10);
        iVar13 = *(int *)(puVar6 + 2);
        uVar1 = *(undefined4 *)((long)puVar6 + 0x1c);
        uVar7 = *(undefined8 *)((long)puVar6 + 0x14);
        tVar2 = *(type *)(puVar6 + 4);
        uVar3 = *(undefined4 *)((long)puVar6 + 0x2c);
        uVar8 = *(undefined8 *)((long)puVar6 + 0x24);
        peVar11 = this->map_;
        uVar4 = this->size_;
        sVar9 = puVar6[1];
        peVar11[uVar4].name.data_ = (char *)*puVar6;
        peVar11[uVar4].name.size_ = sVar9;
        peVar11[uVar4].arg.value_.field_0.int_value = iVar13;
        *(undefined4 *)((long)&peVar11[uVar4].arg.value_.field_0 + 0xc) = uVar1;
        *(undefined8 *)((long)&peVar11[uVar4].arg.value_.field_0.string.value + 4) = uVar7;
        peVar11[uVar4].arg.type_ = tVar2;
        *(undefined8 *)&peVar11[uVar4].arg.field_0x14 = uVar8;
        *(undefined4 *)&peVar11[uVar4].arg.field_0x1c = uVar3;
        this->size_ = this->size_ + 1;
      }
      else if (iVar13 == 0) {
        return uVar10;
      }
      uVar10 = uVar10 + 1;
      bVar12 = bVar12 + 4;
    } while( true );
  }
  uVar10 = 0;
  do {
    iVar13 = *(int *)(*(long *)(ctx + 8) + 0x10 + (ulong)uVar10 * 0x20);
    if (iVar13 == 1) {
      puVar6 = *(undefined8 **)(*(long *)(ctx + 8) + (ulong)uVar10 * 0x20);
      iVar13 = *(int *)(puVar6 + 2);
      uVar1 = *(undefined4 *)((long)puVar6 + 0x1c);
      uVar7 = *(undefined8 *)((long)puVar6 + 0x14);
      tVar2 = *(type *)(puVar6 + 4);
      uVar3 = *(undefined4 *)((long)puVar6 + 0x2c);
      uVar8 = *(undefined8 *)((long)puVar6 + 0x24);
      peVar11 = this->map_;
      uVar4 = this->size_;
      sVar9 = puVar6[1];
      peVar11[uVar4].name.data_ = (char *)*puVar6;
      peVar11[uVar4].name.size_ = sVar9;
      peVar11[uVar4].arg.value_.field_0.int_value = iVar13;
      *(undefined4 *)((long)&peVar11[uVar4].arg.value_.field_0 + 0xc) = uVar1;
      *(undefined8 *)((long)&peVar11[uVar4].arg.value_.field_0.string.value + 4) = uVar7;
      peVar11[uVar4].arg.type_ = tVar2;
      *(undefined8 *)&peVar11[uVar4].arg.field_0x14 = uVar8;
      *(undefined4 *)&peVar11[uVar4].arg.field_0x1c = uVar3;
      this->size_ = this->size_ + 1;
    }
    else if (iVar13 == 0) {
      return uVar10;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  bool use_values = args.type(max_packed_args - 1) == internal::none_type;
  if (use_values) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}